

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessEnergy
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Value *pVVar5;
  char *pcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EnergyReport *aEnergyReport;
  EnergyReportMap *aEnergyReportMap;
  undefined1 *puVar7;
  char *pcVar8;
  undefined1 *puVar9;
  _Alloc_hider _Var10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar11;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  uint8_t count;
  uint16_t scanDuration;
  uint16_t period;
  Address dstAddr;
  uint32_t channelMask;
  CommissionerAppPtr commissioner;
  byte local_2d9;
  string local_2d8;
  string *local_2b8;
  string *local_2b0;
  ushort local_2a4;
  ushort local_2a2;
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  undefined1 local_290 [8];
  char local_288 [16];
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [32];
  format_string_checker<char> *local_238;
  parse_func local_230 [1];
  uint local_21c;
  CommissionerAppPtr local_218;
  string local_200;
  string local_1e0;
  ErrorCode local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  ErrorCode local_198;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  ErrorCode local_170;
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  Error local_148;
  ErrorCode local_120 [2];
  long local_118;
  long local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  Error local_f8;
  Error local_d0;
  Error local_a8;
  Error local_80;
  Error local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_218.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_218.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            (&local_58,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_218);
  local_2a0._0_4_ = local_58.mCode;
  local_298._M_p = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_58.mMessage._M_dataplus._M_p,
             local_58.mMessage._M_dataplus._M_p + local_58.mMessage._M_string_length);
  local_2b8 = (string *)&(__return_storage_ptr__->mError).mMessage;
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
  local_278._M_p = (pointer)&local_268;
  std::__cxx11::string::operator=(local_2b8,(string *)&local_298);
  local_2b0 = (string *)&__return_storage_ptr__->mData;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_278);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_p != &local_268) {
    operator_delete(local_278._M_p);
  }
  if (local_298._M_p != local_288) {
    operator_delete(local_298._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.mMessage._M_dataplus._M_p != &local_58.mMessage.field_2) {
    operator_delete(local_58.mMessage._M_dataplus._M_p);
  }
  if (EVar1 != kNone) goto LAB_00247d3e;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
    local_258._8_8_ = "too few arguments";
    local_258._16_8_ = (_Base_ptr)0x11;
    local_258._24_8_ = (_Base_ptr)0x0;
    local_230[0] = (parse_func)0x0;
    pcVar8 = "too few arguments";
    local_238 = (format_string_checker<char> *)local_258;
    do {
      pcVar6 = pcVar8 + 1;
      if (*pcVar8 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar8 + 2;
      }
      else if (*pcVar8 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar8,"",(format_string_checker<char> *)local_258);
      }
      pcVar8 = pcVar6;
    } while (pcVar6 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_258;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_2d8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_170 = kInvalidArgs;
    local_168 = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,local_2d8._M_dataplus._M_p,
               local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
    local_2a0._0_4_ = local_170;
    local_298._M_p = local_288;
    std::__cxx11::string::_M_construct<char*>((string *)&local_298,local_168,local_168 + local_160);
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
    local_278._M_p = (pointer)&local_268;
    std::__cxx11::string::operator=(local_2b8,(string *)&local_298);
    std::__cxx11::string::operator=(local_2b0,(string *)&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p);
    }
    if (local_298._M_p != local_288) {
      operator_delete(local_298._M_p);
    }
    if (local_168 != local_158) {
      operator_delete(local_168);
    }
    paVar4 = &local_2d8.field_2;
LAB_00247477:
    _Var10._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             **)(paVar4->_M_local_buf + -0x10);
LAB_00247d34:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p == paVar4) goto LAB_00247d3e;
  }
  else {
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"scan","");
    utils::ToLower((string *)local_2a0,pbVar2 + 1);
    utils::ToLower((string *)local_258,&local_2d8);
    if (local_298._M_p == (pointer)local_258._8_8_) {
      if (local_298._M_p == (char *)0x0) {
        bVar11 = true;
      }
      else {
        iVar3 = bcmp((void *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(void *)local_258._0_8_,
                     (size_t)local_298._M_p);
        bVar11 = iVar3 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_);
    }
    if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_290) {
      operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    if (bVar11) {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0xc0 < (ulong)((long)(aExpr->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
        utils::ParseInteger<unsigned_int>(&local_80,&local_21c,pbVar2 + 2);
        local_2a0._0_4_ = local_80.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_80.mMessage._M_dataplus._M_p,
                   local_80.mMessage._M_dataplus._M_p + local_80.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
        local_278._M_p = (pointer)&local_268;
        std::__cxx11::string::operator=(local_2b8,(string *)&local_298);
        std::__cxx11::string::operator=(local_2b0,(string *)&local_278);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p);
        }
        if (local_298._M_p != local_288) {
          operator_delete(local_298._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.mMessage._M_dataplus._M_p != &local_80.mMessage.field_2) {
          operator_delete(local_80.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_00247d3e;
        utils::ParseInteger<unsigned_char>
                  (&local_a8,&local_2d9,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 3);
        local_2a0._0_4_ = local_a8.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_a8.mMessage._M_dataplus._M_p,
                   local_a8.mMessage._M_dataplus._M_p + local_a8.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
        local_278._M_p = (pointer)&local_268;
        std::__cxx11::string::operator=(local_2b8,(string *)&local_298);
        std::__cxx11::string::operator=(local_2b0,(string *)&local_278);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p);
        }
        if (local_298._M_p != local_288) {
          operator_delete(local_298._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.mMessage._M_dataplus._M_p != &local_a8.mMessage.field_2) {
          operator_delete(local_a8.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_00247d3e;
        utils::ParseInteger<unsigned_short>
                  (&local_d0,&local_2a2,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 4);
        local_2a0._0_4_ = local_d0.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_d0.mMessage._M_dataplus._M_p,
                   local_d0.mMessage._M_dataplus._M_p + local_d0.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        local_278._M_p = (pointer)&local_268;
        pVVar5 = Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
        EVar1 = (pVVar5->mError).mCode;
        Value::~Value((Value *)local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.mMessage._M_dataplus._M_p != &local_d0.mMessage.field_2) {
          operator_delete(local_d0.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_00247d3e;
        utils::ParseInteger<unsigned_short>
                  (&local_f8,&local_2a4,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5);
        local_2a0._0_4_ = local_f8.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_f8.mMessage._M_dataplus._M_p,
                   local_f8.mMessage._M_dataplus._M_p + local_f8.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        local_278._M_p = (pointer)&local_268;
        pVVar5 = Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
        EVar1 = (pVVar5->mError).mCode;
        Value::~Value((Value *)local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.mMessage._M_dataplus._M_p != &local_f8.mMessage.field_2) {
          operator_delete(local_f8.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_00247d3e;
        (*((local_218.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x48])
                  (local_120,
                   local_218.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)local_21c,(ulong)local_2d9,(ulong)local_2a2,(ulong)local_2a4,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 6);
        local_2a0._0_4_ = local_120[0];
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_118,local_110 + local_118);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        local_278._M_p = (pointer)&local_268;
        Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
        Value::~Value((Value *)local_2a0);
        paVar4 = &local_108;
        goto LAB_00247477;
      }
      local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
      local_258._8_8_ = "too few arguments";
      local_258._16_8_ = (_Base_ptr)0x11;
      local_258._24_8_ = (_Base_ptr)0x0;
      local_230[0] = (parse_func)0x0;
      pcVar8 = "too few arguments";
      local_238 = (format_string_checker<char> *)local_258;
      do {
        pcVar6 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar8,"",(format_string_checker<char> *)local_258);
        }
        pcVar8 = pcVar6;
      } while (pcVar6 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_258;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_2d8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
      local_198 = kInvalidArgs;
      puVar7 = local_180;
      local_190 = puVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_2d8._M_dataplus._M_p,
                 local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
      local_2a0._0_4_ = local_198;
      local_298._M_p = local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_190,local_190 + local_188);
      local_270 = 0;
      local_268._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
      local_278._M_p = (pointer)&local_268;
      std::__cxx11::string::operator=(local_2b8,(string *)&local_298);
      std::__cxx11::string::operator=(local_2b0,(string *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p);
      }
      puVar9 = local_190;
      if (local_298._M_p != local_288) {
        operator_delete(local_298._M_p);
        puVar9 = local_190;
      }
LAB_00247d20:
      if (puVar9 != puVar7) {
        operator_delete(puVar9);
      }
      paVar4 = &local_2d8.field_2;
      _Var10._M_p = local_2d8._M_dataplus._M_p;
      goto LAB_00247d34;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"report","");
    utils::ToLower((string *)local_2a0,pbVar2 + 1);
    utils::ToLower((string *)local_258,&local_2d8);
    if (local_298._M_p == (pointer)local_258._8_8_) {
      if (local_298._M_p == (char *)0x0) {
        bVar11 = true;
      }
      else {
        iVar3 = bcmp((void *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(void *)local_258._0_8_,
                     (size_t)local_298._M_p);
        bVar11 = iVar3 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_);
    }
    if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_290) {
      operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    if (!bVar11) {
      local_258._0_4_ = string_type;
      local_258._8_8_ = "\'{}\' is not a valid sub-command";
      local_258._16_8_ = (_Base_ptr)0x1f;
      local_258._24_8_ = (_Base_ptr)0x100000000;
      local_230[0] = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar8 = "\'{}\' is not a valid sub-command";
      local_238 = (format_string_checker<char> *)local_258;
      do {
        pcVar6 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar8,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_258);
        }
        pcVar8 = pcVar6;
      } while (pcVar6 != "");
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_258._0_8_ = pbVar2[1]._M_dataplus._M_p;
      local_258._8_8_ = pbVar2[1]._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_258;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_2d8,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_01);
      local_1c0 = kInvalidCommand;
      puVar7 = local_1a8;
      local_1b8 = puVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_2d8._M_dataplus._M_p,
                 local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
      local_2a0._0_4_ = local_1c0;
      local_298._M_p = local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_1b8,local_1b8 + local_1b0);
      local_270 = 0;
      local_268._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
      local_278._M_p = (pointer)&local_268;
      std::__cxx11::string::operator=(local_2b8,(string *)&local_298);
      std::__cxx11::string::operator=(local_2b0,(string *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p);
      }
      puVar9 = local_1b8;
      if (local_298._M_p != local_288) {
        operator_delete(local_298._M_p);
        puVar9 = local_1b8;
      }
      goto LAB_00247d20;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
      iVar3 = (*((local_218.
                  super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x4a])();
      std::
      _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
      ::_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                  *)local_258,
                 (_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                  *)CONCAT44(extraout_var_00,iVar3));
      if (local_230[0] == (parse_func)0x0) {
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"null","");
      }
      else {
        EnergyReportMapToJson_abi_cxx11_(&local_200,(commissioner *)local_258,aEnergyReportMap);
      }
      Value::Value((Value *)local_2a0,&local_200);
      (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
      std::__cxx11::string::operator=(local_2b8,(string *)&local_298);
      std::__cxx11::string::operator=(local_2b0,(string *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p);
      }
      if (local_298._M_p != local_288) {
        operator_delete(local_298._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      std::
      _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
      ::~_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                   *)local_258);
      goto LAB_00247d3e;
    }
    local_258._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_258._8_8_ = (pointer)0x0;
    local_258._16_8_ = (_Base_ptr)0x0;
    Address::Set(&local_148,(Address *)local_258,pbVar2 + 2);
    local_2a0._0_4_ = local_148.mCode;
    local_298._M_p = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_148.mMessage._M_dataplus._M_p,
               local_148.mMessage._M_dataplus._M_p + local_148.mMessage._M_string_length);
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
    local_278._M_p = (pointer)&local_268;
    std::__cxx11::string::operator=(local_2b8,(string *)&local_298);
    std::__cxx11::string::operator=(local_2b0,(string *)&local_278);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p);
    }
    if (local_298._M_p != local_288) {
      operator_delete(local_298._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.mMessage._M_dataplus._M_p != &local_148.mMessage.field_2) {
      operator_delete(local_148.mMessage._M_dataplus._M_p);
    }
    if (EVar1 == kNone) {
      iVar3 = (*((local_218.
                  super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x49])
                        (local_218.
                         super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_258);
      if ((commissioner *)CONCAT44(extraout_var,iVar3) == (commissioner *)0x0) {
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"null","");
      }
      else {
        EnergyReportToJson_abi_cxx11_
                  (&local_1e0,(commissioner *)CONCAT44(extraout_var,iVar3),aEnergyReport);
      }
      Value::Value((Value *)local_2a0,&local_1e0);
      Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
      Value::~Value((Value *)local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
    }
    _Var10._M_p = (pointer)local_258._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00247d3e;
  }
  operator_delete(_Var10._M_p);
LAB_00247d3e:
  if (local_218.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessEnergy(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "scan"))
    {
        uint32_t channelMask;
        uint8_t  count;
        uint16_t period;
        uint16_t scanDuration;
        VerifyOrExit(aExpr.size() >= 7, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(channelMask, aExpr[2]));
        SuccessOrExit(value = ParseInteger(count, aExpr[3]));
        SuccessOrExit(value = ParseInteger(period, aExpr[4]));
        SuccessOrExit(value = ParseInteger(scanDuration, aExpr[5]));
        SuccessOrExit(value = commissioner->EnergyScan(channelMask, count, period, scanDuration, aExpr[6]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "report"))
    {
        if (aExpr.size() >= 3)
        {
            const EnergyReport *report = nullptr;
            Address             dstAddr;
            SuccessOrExit(value = dstAddr.Set(aExpr[2]));
            report = commissioner->GetEnergyReport(dstAddr);
            value  = report == nullptr ? "null" : EnergyReportToJson(*report);
        }
        else
        {
            auto reports = commissioner->GetAllEnergyReports();
            value        = reports.empty() ? "null" : EnergyReportMapToJson(reports);
        }
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}